

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O3

void to_mat44(double *mat4_4,IkReal *eetrans,IkReal *eerot)

{
  long lVar1;
  IkReal *pIVar2;
  
  pIVar2 = eerot + 2;
  lVar1 = 0;
  do {
    *(IkReal *)((long)mat4_4 + lVar1 * 4) = pIVar2[-2];
    *(IkReal *)((long)mat4_4 + lVar1 * 4 + 8) = pIVar2[-1];
    *(IkReal *)((long)mat4_4 + lVar1 * 4 + 0x10) = *pIVar2;
    *(undefined8 *)((long)mat4_4 + lVar1 * 4 + 0x18) = *(undefined8 *)((long)eetrans + lVar1);
    pIVar2 = pIVar2 + 3;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  mat4_4[0xc] = 0.0;
  mat4_4[0xd] = 0.0;
  mat4_4[0xe] = 0.0;
  mat4_4[0xf] = 1.0;
  return;
}

Assistant:

void to_mat44(double * mat4_4, const IkReal* eetrans, const IkReal* eerot)
{
    for(int i=0; i< 3;++i){
        mat4_4[i*4+0] = eerot[i*3+0];
        mat4_4[i*4+1] = eerot[i*3+1];
        mat4_4[i*4+2] = eerot[i*3+2];
        mat4_4[i*4+3] = eetrans[i];
    }
    mat4_4[3*4+0] = 0;
    mat4_4[3*4+1] = 0;
    mat4_4[3*4+2] = 0;
    mat4_4[3*4+3] = 1;
}